

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O3

int __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoLinear>::ClassId
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoLinear> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  string local_58;
  TPZGeoLinear local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"TPZMultiphysicsCompEl","");
  uVar1 = Hash(&local_58);
  iVar2 = TPZCompEl::ClassId((TPZCompEl *)this);
  local_38.super_TPZNodeRep<2,_pztopology::TPZLine>.fNodeIndexes[0]._0_4_ = 0xffffffff;
  local_38.super_TPZNodeRep<2,_pztopology::TPZLine>.fNodeIndexes[0]._4_4_ = 0xffffffff;
  local_38.super_TPZNodeRep<2,_pztopology::TPZLine>.fNodeIndexes[1]._0_4_ = 0xffffffff;
  local_38.super_TPZNodeRep<2,_pztopology::TPZLine>.fNodeIndexes[1]._4_4_ = 0xffffffff;
  local_38.super_TPZNodeRep<2,_pztopology::TPZLine>.super_TPZLine.super_TPZSavable._vptr_TPZSavable
       = (TPZSavable)&PTR__TPZGeoLinear_0188d180;
  iVar3 = pzgeom::TPZGeoLinear::ClassId(&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZMultiphysicsCompEl<TGeometry>::ClassId() const{
    return Hash("TPZMultiphysicsCompEl") ^ TPZMultiphysicsElement::ClassId() << 1 ^ TGeometry().ClassId() << 2;
}